

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

void soul::emitMessage(CompileMessage *m)

{
  CompileMessageGroup messageGroup;
  undefined1 local_100 [248];
  
  local_100._0_8_ = local_100 + 0x18;
  local_100._8_8_ = 0;
  local_100._16_8_ = 4;
  ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
            ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_100,m);
  emitMessage((CompileMessageGroup *)local_100);
  ArrayWithPreallocation<soul::CompileMessage,_4UL>::clear
            ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_100);
  return;
}

Assistant:

void emitMessage (CompileMessage m)
{
    CompileMessageGroup messageGroup;
    messageGroup.messages.push_back (std::move (m));
    emitMessage (messageGroup);
}